

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDfs.c
# Opt level: O3

Vec_Int_t * Ivy_ManDfsSeq(Ivy_Man_t *p,Vec_Int_t **pvLatches)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  Vec_Int_t *p_00;
  int *piVar5;
  Vec_Int_t *vNodes;
  Vec_Ptr_t *pVVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  
  pVVar6 = p->vObjs;
  iVar2 = pVVar6->nSize;
  if (0 < (long)iVar2) {
    lVar8 = 0;
    do {
      if ((pVVar6->pArray[lVar8] != (void *)0x0) &&
         ((*(byte *)((long)pVVar6->pArray[lVar8] + 8) & 0x30) != 0)) {
        __assert_fail("!pObj->fMarkA && !pObj->fMarkB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyDfs.c"
                      ,0x81,"Vec_Int_t *Ivy_ManDfsSeq(Ivy_Man_t *, Vec_Int_t **)");
      }
      lVar8 = lVar8 + 1;
    } while (iVar2 != lVar8);
  }
  iVar3 = p->nObjs[4];
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar7 = iVar3;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar7;
  if (iVar7 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar7 << 2);
  }
  p_00->pArray = piVar5;
  if (0 < iVar2) {
    lVar8 = 0;
    do {
      piVar5 = (int *)pVVar6->pArray[lVar8];
      if ((piVar5 != (int *)0x0) && ((piVar5[2] & 0xfU) == 4)) {
        Vec_IntPush(p_00,*piVar5);
        pVVar6 = p->vObjs;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar6->nSize);
  }
  iVar2 = p->nObjs[5];
  iVar3 = p->nObjs[6];
  vNodes = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < (iVar3 + iVar2) - 1U) {
    iVar7 = iVar3 + iVar2;
  }
  vNodes->nSize = 0;
  vNodes->nCap = iVar7;
  if (iVar7 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar7 << 2);
  }
  vNodes->pArray = piVar5;
  pVVar6 = p->vPos;
  if (0 < pVVar6->nSize) {
    lVar8 = 0;
    do {
      Ivy_ManDfs_rec(p,(Ivy_Obj_t *)
                       (*(ulong *)((long)pVVar6->pArray[lVar8] + 0x10) & 0xfffffffffffffffe),vNodes)
      ;
      lVar8 = lVar8 + 1;
      pVVar6 = p->vPos;
    } while (lVar8 < pVVar6->nSize);
  }
  iVar2 = p_00->nSize;
  if (0 < (long)iVar2) {
    piVar5 = p_00->pArray;
    uVar9 = 0;
    do {
      iVar3 = piVar5[uVar9];
      if (((long)iVar3 < 0) || (p->vObjs->nSize <= iVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar4 = p->vObjs->pArray[iVar3];
      if (pvVar4 == (void *)0x0) break;
      Ivy_ManDfs_rec(p,(Ivy_Obj_t *)(*(ulong *)((long)pvVar4 + 0x10) & 0xfffffffffffffffe),vNodes);
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)(long)iVar2);
  }
  pVVar6 = p->vObjs;
  if (0 < pVVar6->nSize) {
    lVar8 = 0;
    do {
      if (pVVar6->pArray[lVar8] != (void *)0x0) {
        pbVar1 = (byte *)((long)pVVar6->pArray[lVar8] + 8);
        *pbVar1 = *pbVar1 & 0xef;
        pVVar6 = p->vObjs;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar6->nSize);
  }
  if (pvLatches == (Vec_Int_t **)0x0) {
    if (p_00->pArray != (int *)0x0) {
      free(p_00->pArray);
    }
    free(p_00);
  }
  else {
    *pvLatches = p_00;
  }
  return vNodes;
}

Assistant:

Vec_Int_t * Ivy_ManDfsSeq( Ivy_Man_t * p, Vec_Int_t ** pvLatches )
{
    Vec_Int_t * vNodes, * vLatches;
    Ivy_Obj_t * pObj;
    int i;
//    assert( Ivy_ManLatchNum(p) > 0 );
    // make sure the nodes are not marked
    Ivy_ManForEachObj( p, pObj, i )
        assert( !pObj->fMarkA && !pObj->fMarkB );
    // collect the latches
    vLatches = Vec_IntAlloc( Ivy_ManLatchNum(p) );
    Ivy_ManForEachLatch( p, pObj, i )
        Vec_IntPush( vLatches, pObj->Id );
    // collect the nodes
    vNodes = Vec_IntAlloc( Ivy_ManNodeNum(p) );
    Ivy_ManForEachPo( p, pObj, i )
        Ivy_ManDfs_rec( p, Ivy_ObjFanin0(pObj), vNodes );
    Ivy_ManForEachNodeVec( p, vLatches, pObj, i )
        Ivy_ManDfs_rec( p, Ivy_ObjFanin0(pObj), vNodes );
    // unmark the collected nodes
//    Ivy_ManForEachNodeVec( p, vNodes, pObj, i )
//        Ivy_ObjClearMarkA(pObj);
    Ivy_ManForEachObj( p, pObj, i )
        Ivy_ObjClearMarkA(pObj);
    // make sure network does not have dangling nodes
//    assert( Vec_IntSize(vNodes) == Ivy_ManNodeNum(p) + Ivy_ManBufNum(p) );

// temporary!!!

    if ( pvLatches == NULL )
        Vec_IntFree( vLatches );
    else
        *pvLatches = vLatches;
    return vNodes;
}